

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

int Dau_DsdDecomposeDoubleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  word (*pOut) [64];
  abctime aVar5;
  uint u;
  uint uVar6;
  uint v;
  uint nVars_00;
  char pBuffer [10];
  word pTtTemp [2] [64];
  
  aVar4 = Abc_Clock();
  pOut = pTtTemp + 1;
  uVar6 = nVars;
  do {
    while (v = uVar6 - 1, (int)uVar6 < 2) {
      uVar6 = nVars;
      if (v == 0) {
LAB_003f2c4b:
        aVar5 = Abc_Clock();
        s_Times_1 = s_Times_1 + (aVar5 - aVar4);
        return nVars;
      }
    }
    nVars_00 = nVars;
    for (u = uVar6 - 2; uVar6 = v, nVars = nVars_00, -1 < (int)u; u = u - 1) {
      if (p->Cache[pVars[v]][pVars[u]] == '\0') {
        pBuffer[8] = '\0';
        pBuffer[9] = '\0';
        pBuffer[0] = '\0';
        pBuffer[1] = '\0';
        pBuffer[2] = '\0';
        pBuffer[3] = '\0';
        pBuffer[4] = '\0';
        pBuffer[5] = '\0';
        pBuffer[6] = '\0';
        pBuffer[7] = '\0';
        iVar3 = 1 << ((char)nVars_00 - 6U & 0x1f);
        if ((int)nVars_00 < 7) {
          iVar3 = 1;
        }
        iVar2 = Dau_DsdFindSupportOne(p,pTruth,pVars,nVars_00,v,u);
        if ((int)v <= (int)u) {
          __assert_fail("v > u",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                        ,0x647,
                        "int Dau_DsdDecomposeDoubleVarsOne(Dau_Dsd_t *, word *, int *, int, int, int)"
                       );
        }
        if (iVar2 == 1) {
          iVar2 = Abc_TtCheckEqualCofs(pTruth,iVar3,u,v,0,3);
          if (iVar2 == 0) {
            iVar2 = Abc_TtCheckEqualCofs(pTruth,iVar3,u,v,1,3);
            if (iVar2 == 0) goto LAB_003f2c19;
            sprintf(pBuffer,"(!%c!%c)",(ulong)(pVars[v] + 0x61),(ulong)(pVars[u] + 0x61));
            Abc_TtCofactor1p(pTtTemp[0],pTruth,iVar3,v);
            Abc_TtCofactor1(pTtTemp[0],iVar3,u);
            Abc_TtCofactor0p(*pOut,pTruth,iVar3,v);
LAB_003f2b59:
            Abc_TtCofactor0(*pOut,iVar3,u);
          }
          else {
            sprintf(pBuffer,"(!%c%c)",(ulong)(pVars[v] + 0x61),(ulong)(pVars[u] + 0x61));
LAB_003f29f5:
            Abc_TtCofactor0p(pTtTemp[0],pTruth,iVar3,v);
            Abc_TtCofactor0(pTtTemp[0],iVar3,u);
            Abc_TtCofactor0p(*pOut,pTruth,iVar3,v);
LAB_003f2a1e:
            Abc_TtCofactor1(*pOut,iVar3,u);
          }
          Dau_DsdTtElems();
          Abc_TtMux(pTruth,Dau_DsdTtElems::pTtElems[u],*pOut,pTtTemp[0],iVar3);
          if (pBuffer[0] == '\0') {
            __assert_fail("pBuffer[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                          ,0x699,
                          "int Dau_DsdDecomposeDoubleVarsOne(Dau_Dsd_t *, word *, int *, int, int, int)"
                         );
          }
          iVar3 = Dau_DsdAddVarDef(p,pBuffer);
          pVars[u] = iVar3;
          nVars = nVars_00 - 1;
          pVars[v] = pVars[(long)(int)nVars_00 + -1];
          Abc_TtSwapVars(pTruth,nVars_00,v,nVars);
          iVar3 = Dau_DsdDecomposeSingleVarOne(p,pTruth,pVars,nVars,u);
          if (iVar3 != 0) {
            nVars = Dau_DsdDecomposeSingleVar(p,pTruth,pVars,nVars_00 - 2);
          }
        }
        else if (iVar2 == 2) {
          iVar2 = Abc_TtCheckEqualCofs(pTruth,iVar3,u,v,0,2);
          if (iVar2 != 0) {
            sprintf(pBuffer,"(%c%c)",(ulong)(pVars[v] + 0x61),(ulong)(pVars[u] + 0x61));
            Abc_TtCofactor0p(pTtTemp[0],pTruth,iVar3,v);
            Abc_TtCofactor0(pTtTemp[0],iVar3,u);
            Abc_TtCofactor1p(*pOut,pTruth,iVar3,v);
            goto LAB_003f2a1e;
          }
          iVar2 = Abc_TtCheckEqualCofs(pTruth,iVar3,u,v,0,3);
          if (iVar2 != 0) {
            sprintf(pBuffer,"(%c!%c)",(ulong)(pVars[v] + 0x61),(ulong)(pVars[u] + 0x61));
            Abc_TtCofactor0p(pTtTemp[0],pTruth,iVar3,v);
            Abc_TtCofactor0(pTtTemp[0],iVar3,u);
            Abc_TtCofactor1p(*pOut,pTruth,iVar3,v);
            goto LAB_003f2b59;
          }
        }
        else if (((iVar2 == 3) && (iVar2 = Abc_TtCheckEqualCofs(pTruth,iVar3,u,v,0,3), iVar2 != 0))
                && (iVar2 = Abc_TtCheckEqualCofs(pTruth,iVar3,u,v,1,2), iVar2 != 0)) {
          sprintf(pBuffer,"[%c%c]",(ulong)(pVars[v] + 0x61),(ulong)(pVars[u] + 0x61));
          goto LAB_003f29f5;
        }
LAB_003f2c19:
        if (nVars == 0) {
          nVars = 0;
          goto LAB_003f2c4b;
        }
        bVar1 = nVars < (int)nVars_00;
        nVars_00 = nVars;
        uVar6 = nVars;
        if (bVar1) break;
      }
    }
  } while( true );
}

Assistant:

int Dau_DsdDecomposeDoubleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v, u, nVarsOld;
        for ( v = nVars - 1; v > 0; v-- )
        {
            for ( u = v - 1; u >= 0; u-- )
            {
                if ( Dau_DsdLookupVarCache( p, pVars[v], pVars[u] ) )
                    continue;
                nVarsOld = nVars;
                nVars = Dau_DsdDecomposeDoubleVarsOne( p, pTruth, pVars, nVars, v, u );
                if ( nVars == 0 )
                {
                    s_Times[1] += Abc_Clock() - clk;
                    return 0;
                }
                if ( nVarsOld > nVars )
                    break;
            }
            if ( u >= 0 ) // found
                break;
        }
        if ( v == 0 ) // not found
            break;
    }
    s_Times[1] += Abc_Clock() - clk;
    return nVars;
}